

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_tests.cpp
# Opt level: O0

void __thiscall test::spi_test::SPITest::FatalFailure_Sub(SPITest *this,int *count)

{
  bool bVar1;
  char *pcVar2;
  AssertionHelper local_9e68;
  Fixed local_9e38;
  anon_class_8_1_8991fb9c local_9cb0;
  undefined1 local_9ca8 [8];
  AssertionResult iutest_spi_ar_82;
  Fixed local_9c50;
  anon_class_8_1_8991fb9c local_9ac8;
  undefined1 local_9ac0 [8];
  AssertionResult iutest_spi_ar_81;
  Fixed local_9a68;
  anon_class_1_0_00000001 local_98d9;
  undefined1 local_98d8 [8];
  AssertionResult iutest_spi_ar_80;
  Fixed local_9880;
  anon_class_1_0_00000001 local_96f1;
  undefined1 local_96f0 [8];
  AssertionResult iutest_spi_ar_79;
  Fixed local_9698;
  anon_class_8_1_8991fb9c local_9510;
  undefined1 local_9508 [8];
  AssertionResult iutest_spi_ar_78;
  Fixed local_94b0;
  anon_class_1_0_00000001 local_9321;
  undefined1 local_9320 [8];
  AssertionResult iutest_spi_ar_77;
  Fixed local_92c8;
  anon_class_1_0_00000001 local_9139;
  undefined1 local_9138 [8];
  AssertionResult iutest_spi_ar_76;
  Fixed local_90e0;
  anon_class_8_1_8991fb9c local_8f58;
  undefined1 local_8f50 [8];
  AssertionResult iutest_spi_ar_75;
  Fixed local_8ef8;
  anon_class_1_0_00000001 local_8d69;
  undefined1 local_8d68 [8];
  AssertionResult iutest_spi_ar_74;
  Fixed local_8d10;
  anon_class_1_0_00000001 local_8b81;
  undefined1 local_8b80 [8];
  AssertionResult iutest_spi_ar_73;
  Fixed local_8b28;
  anon_class_8_1_8991fb9c local_89a0;
  undefined1 local_8998 [8];
  AssertionResult iutest_spi_ar_72;
  Fixed local_8940;
  anon_class_8_1_8991fb9c local_87b8;
  undefined1 local_87b0 [8];
  AssertionResult iutest_spi_ar_71;
  Fixed local_8758;
  anon_class_8_1_8991fb9c local_85d0;
  undefined1 local_85c8 [8];
  AssertionResult iutest_spi_ar_70;
  Fixed local_8570;
  anon_class_8_1_8991fb9c local_83e8;
  undefined1 local_83e0 [8];
  AssertionResult iutest_spi_ar_69;
  Fixed local_8388;
  anon_class_8_1_8991fb9c local_8200;
  undefined1 local_81f8 [8];
  AssertionResult iutest_spi_ar_68;
  Fixed local_81a0;
  anon_class_8_1_8991fb9c local_8018;
  undefined1 local_8010 [8];
  AssertionResult iutest_spi_ar_67;
  Fixed local_7fb8;
  anon_class_8_1_8991fb9c local_7e30;
  undefined1 local_7e28 [8];
  AssertionResult iutest_spi_ar_66;
  Fixed local_7dd0;
  anon_class_8_1_8991fb9c local_7c48;
  undefined1 local_7c40 [8];
  AssertionResult iutest_spi_ar_65;
  Fixed local_7be8;
  anon_class_8_1_8991fb9c local_7a60;
  undefined1 local_7a58 [8];
  AssertionResult iutest_spi_ar_64;
  Fixed local_7a00;
  anon_class_1_0_00000001 local_7871;
  undefined1 local_7870 [8];
  AssertionResult iutest_spi_ar_63;
  Fixed local_7818;
  anon_class_1_0_00000001 local_7689;
  undefined1 local_7688 [8];
  AssertionResult iutest_spi_ar_62;
  Fixed local_7630;
  anon_class_8_1_8991fb9c local_74a8;
  undefined1 local_74a0 [8];
  AssertionResult iutest_spi_ar_61;
  Fixed local_7448;
  anon_class_8_1_8991fb9c local_72c0;
  undefined1 local_72b8 [8];
  AssertionResult iutest_spi_ar_60;
  Fixed local_7260;
  anon_class_1_0_00000001 local_70d1;
  undefined1 local_70d0 [8];
  AssertionResult iutest_spi_ar_59;
  Fixed local_7078;
  anon_class_1_0_00000001 local_6ee9;
  undefined1 local_6ee8 [8];
  AssertionResult iutest_spi_ar_58;
  Fixed local_6e90;
  anon_class_1_0_00000001 local_6d01;
  undefined1 local_6d00 [8];
  AssertionResult iutest_spi_ar_57;
  Fixed local_6ca8;
  anon_class_1_0_00000001 local_6b19;
  undefined1 local_6b18 [8];
  AssertionResult iutest_spi_ar_56;
  Fixed local_6ac0;
  anon_class_1_0_00000001 local_6931;
  undefined1 local_6930 [8];
  AssertionResult iutest_spi_ar_55;
  Fixed local_68d8;
  anon_class_1_0_00000001 local_6749;
  undefined1 local_6748 [8];
  AssertionResult iutest_spi_ar_54;
  Fixed local_66f0;
  anon_class_1_0_00000001 local_6561;
  undefined1 local_6560 [8];
  AssertionResult iutest_spi_ar_53;
  Fixed local_6508;
  anon_class_1_0_00000001 local_6379;
  undefined1 local_6378 [8];
  AssertionResult iutest_spi_ar_52;
  Fixed local_6320;
  anon_class_8_1_8991fb9c local_6198;
  undefined1 local_6190 [8];
  AssertionResult iutest_spi_ar_51;
  Fixed local_6138;
  anon_class_8_1_8991fb9c local_5fb0;
  undefined1 local_5fa8 [8];
  AssertionResult iutest_spi_ar_50;
  Fixed local_5f50;
  anon_class_8_1_8991fb9c local_5dc8;
  undefined1 local_5dc0 [8];
  AssertionResult iutest_spi_ar_49;
  Fixed local_5d68;
  anon_class_8_1_8991fb9c local_5be0;
  undefined1 local_5bd8 [8];
  AssertionResult iutest_spi_ar_48;
  Fixed local_5b80;
  anon_class_1_0_00000001 local_59f1;
  undefined1 local_59f0 [8];
  AssertionResult iutest_spi_ar_47;
  Fixed local_5998;
  anon_class_1_0_00000001 local_5809;
  undefined1 local_5808 [8];
  AssertionResult iutest_spi_ar_46;
  Fixed local_57b0;
  anon_class_1_0_00000001 local_5621;
  undefined1 local_5620 [8];
  AssertionResult iutest_spi_ar_45;
  Fixed local_55c8;
  anon_class_8_1_8991fb9c local_5440;
  undefined1 local_5438 [8];
  AssertionResult iutest_spi_ar_44;
  Fixed local_53e0;
  anon_class_8_1_8991fb9c local_5258;
  undefined1 local_5250 [8];
  AssertionResult iutest_spi_ar_43;
  Fixed local_51f8;
  anon_class_8_1_8991fb9c local_5070;
  undefined1 local_5068 [8];
  AssertionResult iutest_spi_ar_42;
  Fixed local_5010;
  anon_class_8_1_8991fb9c local_4e88;
  undefined1 local_4e80 [8];
  AssertionResult iutest_spi_ar_41;
  Fixed local_4e28;
  anon_class_8_1_8991fb9c local_4ca0;
  undefined1 local_4c98 [8];
  AssertionResult iutest_spi_ar_40;
  Fixed local_4c40;
  anon_class_1_0_00000001 local_4ab1;
  undefined1 local_4ab0 [8];
  AssertionResult iutest_spi_ar_39;
  Fixed local_4a58;
  anon_class_1_0_00000001 local_48c9;
  undefined1 local_48c8 [8];
  AssertionResult iutest_spi_ar_38;
  Fixed local_4870;
  anon_class_8_1_8991fb9c local_46e8;
  undefined1 local_46e0 [8];
  AssertionResult iutest_spi_ar_37;
  Fixed local_4688;
  anon_class_8_1_8991fb9c local_4500;
  undefined1 local_44f8 [8];
  AssertionResult iutest_spi_ar_36;
  Fixed local_44a0;
  anon_class_8_1_8991fb9c local_4318;
  undefined1 local_4310 [8];
  AssertionResult iutest_spi_ar_35;
  Fixed local_42b8;
  anon_class_8_1_8991fb9c local_4130;
  undefined1 local_4128 [8];
  AssertionResult iutest_spi_ar_34;
  Fixed local_40d0;
  anon_class_8_1_8991fb9c local_3f48;
  undefined1 local_3f40 [8];
  AssertionResult iutest_spi_ar_33;
  Fixed local_3ee8;
  anon_class_8_1_8991fb9c local_3d60;
  undefined1 local_3d58 [8];
  AssertionResult iutest_spi_ar_32;
  Fixed local_3d00;
  anon_class_1_0_00000001 local_3b71;
  undefined1 local_3b70 [8];
  AssertionResult iutest_spi_ar_31;
  Fixed local_3b18;
  anon_class_1_0_00000001 local_3989;
  undefined1 local_3988 [8];
  AssertionResult iutest_spi_ar_30;
  Fixed local_3930;
  anon_class_8_1_8991fb9c local_37a8;
  undefined1 local_37a0 [8];
  AssertionResult iutest_spi_ar_29;
  Fixed local_3748;
  anon_class_8_1_8991fb9c local_35c0;
  undefined1 local_35b8 [8];
  AssertionResult iutest_spi_ar_28;
  Fixed local_3560;
  anon_class_8_1_8991fb9c local_33d8;
  undefined1 local_33d0 [8];
  AssertionResult iutest_spi_ar_27;
  Fixed local_3378;
  anon_class_1_0_00000001 local_31e9;
  undefined1 local_31e8 [8];
  AssertionResult iutest_spi_ar_26;
  Fixed local_3190;
  anon_class_8_1_8991fb9c local_3008;
  undefined1 local_3000 [8];
  AssertionResult iutest_spi_ar_25;
  Fixed local_2fa8;
  anon_class_8_1_8991fb9c local_2e20;
  undefined1 local_2e18 [8];
  AssertionResult iutest_spi_ar_24;
  Fixed local_2dc0;
  anon_class_1_0_00000001 local_2c31;
  undefined1 local_2c30 [8];
  AssertionResult iutest_spi_ar_23;
  Fixed local_2bd8;
  anon_class_1_0_00000001 local_2a49;
  undefined1 local_2a48 [8];
  AssertionResult iutest_spi_ar_22;
  Fixed local_29f0;
  anon_class_1_0_00000001 local_2861;
  undefined1 local_2860 [8];
  AssertionResult iutest_spi_ar_21;
  Fixed local_2808;
  anon_class_8_1_8991fb9c local_2680;
  undefined1 local_2678 [8];
  AssertionResult iutest_spi_ar_20;
  Fixed local_2620;
  anon_class_1_0_00000001 local_2491;
  undefined1 local_2490 [8];
  AssertionResult iutest_spi_ar_19;
  Fixed local_2438;
  anon_class_1_0_00000001 local_22a9;
  undefined1 local_22a8 [8];
  AssertionResult iutest_spi_ar_18;
  Fixed local_2250;
  anon_class_1_0_00000001 local_20c1;
  undefined1 local_20c0 [8];
  AssertionResult iutest_spi_ar_17;
  Fixed local_2068;
  anon_class_8_1_8991fb9c local_1ee0;
  undefined1 local_1ed8 [8];
  AssertionResult iutest_spi_ar_16;
  Fixed local_1e80;
  anon_class_8_1_8991fb9c local_1cf8;
  undefined1 local_1cf0 [8];
  AssertionResult iutest_spi_ar_15;
  Fixed local_1c98;
  anon_class_1_0_00000001 local_1b09;
  undefined1 local_1b08 [8];
  AssertionResult iutest_spi_ar_14;
  Fixed local_1ab0;
  anon_class_1_0_00000001 local_1921;
  undefined1 local_1920 [8];
  AssertionResult iutest_spi_ar_13;
  Fixed local_18c8;
  anon_class_1_0_00000001 local_1739;
  undefined1 local_1738 [8];
  AssertionResult iutest_spi_ar_12;
  Fixed local_16e0;
  anon_class_1_0_00000001 local_1551;
  undefined1 local_1550 [8];
  AssertionResult iutest_spi_ar_11;
  Fixed local_14f8;
  anon_class_1_0_00000001 local_1369;
  undefined1 local_1368 [8];
  AssertionResult iutest_spi_ar_10;
  Fixed local_1310;
  anon_class_1_0_00000001 local_1181;
  undefined1 local_1180 [8];
  AssertionResult iutest_spi_ar_9;
  Fixed local_1128;
  anon_class_1_0_00000001 local_f99;
  undefined1 local_f98 [8];
  AssertionResult iutest_spi_ar_8;
  Fixed local_f40;
  anon_class_1_0_00000001 local_db1;
  undefined1 local_db0 [8];
  AssertionResult iutest_spi_ar_7;
  Fixed local_d58;
  anon_class_8_1_8991fb9c local_bd0;
  undefined1 local_bc8 [8];
  AssertionResult iutest_spi_ar_6;
  Fixed local_b70;
  anon_class_8_1_8991fb9c local_9e8;
  undefined1 local_9e0 [8];
  AssertionResult iutest_spi_ar_5;
  Fixed local_988;
  anon_class_8_1_8991fb9c local_800;
  undefined1 local_7f8 [8];
  AssertionResult iutest_spi_ar_4;
  Fixed local_7a0;
  anon_class_1_0_00000001 local_611;
  undefined1 local_610 [8];
  AssertionResult iutest_spi_ar_3;
  Fixed local_5b8;
  anon_class_1_0_00000001 local_429;
  undefined1 local_428 [8];
  AssertionResult iutest_spi_ar_2;
  Fixed local_3d0;
  anon_class_1_0_00000001 local_241;
  undefined1 local_240 [8];
  AssertionResult iutest_spi_ar_1;
  AssertionHelper local_210;
  Fixed local_1e0;
  anon_class_1_0_00000001 local_41;
  undefined1 local_40 [8];
  AssertionResult iutest_spi_ar;
  int *count_local;
  SPITest *this_local;
  
  iutest_spi_ar._32_8_ = count;
  iutest::detail::AlwaysZero();
  FatalFailure_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_40,&local_41);
  bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_40);
  if (!bVar1) {
    memset(&local_1e0,0,0x188);
    iutest::AssertionHelper::Fixed::Fixed(&local_1e0);
    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_40);
    iutest::AssertionHelper::AssertionHelper
              (&local_210,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
               ,0x1e,pcVar2,kFatalFailure);
    iutest::AssertionHelper::operator=(&local_210,&local_1e0);
    iutest::AssertionHelper::~AssertionHelper(&local_210);
    iutest::AssertionHelper::Fixed::~Fixed(&local_1e0);
  }
  iutest_spi_ar_1._37_3_ = 0;
  iutest_spi_ar_1._36_1_ = !bVar1;
  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_40);
  if (iutest_spi_ar_1._36_4_ == 0) {
    iutest::detail::AlwaysZero();
    FatalFailure_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_240,&local_241);
    bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_240);
    if (!bVar1) {
      memset(&local_3d0,0,0x188);
      iutest::AssertionHelper::Fixed::Fixed(&local_3d0);
      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_240);
      iutest::AssertionHelper::AssertionHelper
                ((AssertionHelper *)&iutest_spi_ar_2.m_result,
                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                 ,0x1f,pcVar2,kFatalFailure);
      iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_2.m_result,&local_3d0);
      iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_2.m_result);
      iutest::AssertionHelper::Fixed::~Fixed(&local_3d0);
    }
    iutest_spi_ar_1._37_3_ = 0;
    iutest_spi_ar_1._36_1_ = !bVar1;
    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_240);
    if (iutest_spi_ar_1._36_4_ == 0) {
      iutest::detail::AlwaysZero();
      FatalFailure_Sub::anon_class_1_0_00000001::operator()((AssertionResult *)local_428,&local_429)
      ;
      bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_428);
      if (!bVar1) {
        memset(&local_5b8,0,0x188);
        iutest::AssertionHelper::Fixed::Fixed(&local_5b8);
        pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_428);
        iutest::AssertionHelper::AssertionHelper
                  ((AssertionHelper *)&iutest_spi_ar_3.m_result,
                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                   ,0x20,pcVar2,kFatalFailure);
        iutest::AssertionHelper::operator=((AssertionHelper *)&iutest_spi_ar_3.m_result,&local_5b8);
        iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_3.m_result);
        iutest::AssertionHelper::Fixed::~Fixed(&local_5b8);
      }
      iutest_spi_ar_1._37_3_ = 0;
      iutest_spi_ar_1._36_1_ = !bVar1;
      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_428);
      if (iutest_spi_ar_1._36_4_ == 0) {
        iutest::detail::AlwaysZero();
        FatalFailure_Sub::anon_class_1_0_00000001::operator()
                  ((AssertionResult *)local_610,&local_611);
        bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_610);
        if (!bVar1) {
          memset(&local_7a0,0,0x188);
          iutest::AssertionHelper::Fixed::Fixed(&local_7a0);
          pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_610);
          iutest::AssertionHelper::AssertionHelper
                    ((AssertionHelper *)&iutest_spi_ar_4.m_result,
                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                     ,0x21,pcVar2,kFatalFailure);
          iutest::AssertionHelper::operator=
                    ((AssertionHelper *)&iutest_spi_ar_4.m_result,&local_7a0);
          iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_4.m_result);
          iutest::AssertionHelper::Fixed::~Fixed(&local_7a0);
        }
        iutest_spi_ar_1._37_3_ = 0;
        iutest_spi_ar_1._36_1_ = !bVar1;
        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_610);
        if (iutest_spi_ar_1._36_4_ == 0) {
          iutest::detail::AlwaysZero();
          local_800.this = this;
          FatalFailure_Sub::anon_class_8_1_8991fb9c::operator()
                    ((AssertionResult *)local_7f8,&local_800);
          bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_7f8);
          if (!bVar1) {
            memset(&local_988,0,0x188);
            iutest::AssertionHelper::Fixed::Fixed(&local_988);
            pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_7f8);
            iutest::AssertionHelper::AssertionHelper
                      ((AssertionHelper *)&iutest_spi_ar_5.m_result,
                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                       ,0x22,pcVar2,kFatalFailure);
            iutest::AssertionHelper::operator=
                      ((AssertionHelper *)&iutest_spi_ar_5.m_result,&local_988);
            iutest::AssertionHelper::~AssertionHelper((AssertionHelper *)&iutest_spi_ar_5.m_result);
            iutest::AssertionHelper::Fixed::~Fixed(&local_988);
          }
          iutest_spi_ar_1._37_3_ = 0;
          iutest_spi_ar_1._36_1_ = !bVar1;
          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_7f8);
          if (iutest_spi_ar_1._36_4_ == 0) {
            iutest::detail::AlwaysZero();
            local_9e8.this = this;
            FatalFailure_Sub::anon_class_8_1_8991fb9c::operator()
                      ((AssertionResult *)local_9e0,&local_9e8);
            bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
            if (!bVar1) {
              memset(&local_b70,0,0x188);
              iutest::AssertionHelper::Fixed::Fixed(&local_b70);
              pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_9e0);
              iutest::AssertionHelper::AssertionHelper
                        ((AssertionHelper *)&iutest_spi_ar_6.m_result,
                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                         ,0x24,pcVar2,kFatalFailure);
              iutest::AssertionHelper::operator=
                        ((AssertionHelper *)&iutest_spi_ar_6.m_result,&local_b70);
              iutest::AssertionHelper::~AssertionHelper
                        ((AssertionHelper *)&iutest_spi_ar_6.m_result);
              iutest::AssertionHelper::Fixed::~Fixed(&local_b70);
            }
            iutest_spi_ar_1._37_3_ = 0;
            iutest_spi_ar_1._36_1_ = !bVar1;
            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
            if (iutest_spi_ar_1._36_4_ == 0) {
              iutest::detail::AlwaysZero();
              local_bd0.this = this;
              FatalFailure_Sub::anon_class_8_1_8991fb9c::operator()
                        ((AssertionResult *)local_bc8,&local_bd0);
              bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_bc8);
              if (!bVar1) {
                memset(&local_d58,0,0x188);
                iutest::AssertionHelper::Fixed::Fixed(&local_d58);
                pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_bc8);
                iutest::AssertionHelper::AssertionHelper
                          ((AssertionHelper *)&iutest_spi_ar_7.m_result,
                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                           ,0x25,pcVar2,kFatalFailure);
                iutest::AssertionHelper::operator=
                          ((AssertionHelper *)&iutest_spi_ar_7.m_result,&local_d58);
                iutest::AssertionHelper::~AssertionHelper
                          ((AssertionHelper *)&iutest_spi_ar_7.m_result);
                iutest::AssertionHelper::Fixed::~Fixed(&local_d58);
              }
              iutest_spi_ar_1._37_3_ = 0;
              iutest_spi_ar_1._36_1_ = !bVar1;
              iutest::AssertionResult::~AssertionResult((AssertionResult *)local_bc8);
              if (iutest_spi_ar_1._36_4_ == 0) {
                iutest::detail::AlwaysZero();
                FatalFailure_Sub::anon_class_1_0_00000001::operator()
                          ((AssertionResult *)local_db0,&local_db1);
                bVar1 = iutest::AssertionResult::operator_cast_to_bool((AssertionResult *)local_db0)
                ;
                if (!bVar1) {
                  memset(&local_f40,0,0x188);
                  iutest::AssertionHelper::Fixed::Fixed(&local_f40);
                  pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_db0);
                  iutest::AssertionHelper::AssertionHelper
                            ((AssertionHelper *)&iutest_spi_ar_8.m_result,
                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                             ,0x27,pcVar2,kFatalFailure);
                  iutest::AssertionHelper::operator=
                            ((AssertionHelper *)&iutest_spi_ar_8.m_result,&local_f40);
                  iutest::AssertionHelper::~AssertionHelper
                            ((AssertionHelper *)&iutest_spi_ar_8.m_result);
                  iutest::AssertionHelper::Fixed::~Fixed(&local_f40);
                }
                iutest_spi_ar_1._37_3_ = 0;
                iutest_spi_ar_1._36_1_ = !bVar1;
                iutest::AssertionResult::~AssertionResult((AssertionResult *)local_db0);
                if (iutest_spi_ar_1._36_4_ == 0) {
                  iutest::detail::AlwaysZero();
                  FatalFailure_Sub::anon_class_1_0_00000001::operator()
                            ((AssertionResult *)local_f98,&local_f99);
                  bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_f98);
                  if (!bVar1) {
                    memset(&local_1128,0,0x188);
                    iutest::AssertionHelper::Fixed::Fixed(&local_1128);
                    pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_f98);
                    iutest::AssertionHelper::AssertionHelper
                              ((AssertionHelper *)&iutest_spi_ar_9.m_result,
                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                               ,0x28,pcVar2,kFatalFailure);
                    iutest::AssertionHelper::operator=
                              ((AssertionHelper *)&iutest_spi_ar_9.m_result,&local_1128);
                    iutest::AssertionHelper::~AssertionHelper
                              ((AssertionHelper *)&iutest_spi_ar_9.m_result);
                    iutest::AssertionHelper::Fixed::~Fixed(&local_1128);
                  }
                  iutest_spi_ar_1._37_3_ = 0;
                  iutest_spi_ar_1._36_1_ = !bVar1;
                  iutest::AssertionResult::~AssertionResult((AssertionResult *)local_f98);
                  if (iutest_spi_ar_1._36_4_ == 0) {
                    iutest::detail::AlwaysZero();
                    FatalFailure_Sub::anon_class_1_0_00000001::operator()
                              ((AssertionResult *)local_1180,&local_1181);
                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_1180);
                    if (!bVar1) {
                      memset(&local_1310,0,0x188);
                      iutest::AssertionHelper::Fixed::Fixed(&local_1310);
                      pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1180);
                      iutest::AssertionHelper::AssertionHelper
                                ((AssertionHelper *)&iutest_spi_ar_10.m_result,
                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                 ,0x29,pcVar2,kFatalFailure);
                      iutest::AssertionHelper::operator=
                                ((AssertionHelper *)&iutest_spi_ar_10.m_result,&local_1310);
                      iutest::AssertionHelper::~AssertionHelper
                                ((AssertionHelper *)&iutest_spi_ar_10.m_result);
                      iutest::AssertionHelper::Fixed::~Fixed(&local_1310);
                    }
                    iutest_spi_ar_1._37_3_ = 0;
                    iutest_spi_ar_1._36_1_ = !bVar1;
                    iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1180);
                    if (iutest_spi_ar_1._36_4_ == 0) {
                      iutest::detail::AlwaysZero();
                      FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                ((AssertionResult *)local_1368,&local_1369);
                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_1368);
                      if (!bVar1) {
                        memset(&local_14f8,0,0x188);
                        iutest::AssertionHelper::Fixed::Fixed(&local_14f8);
                        pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1368);
                        iutest::AssertionHelper::AssertionHelper
                                  ((AssertionHelper *)&iutest_spi_ar_11.m_result,
                                   "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                   ,0x2a,pcVar2,kFatalFailure);
                        iutest::AssertionHelper::operator=
                                  ((AssertionHelper *)&iutest_spi_ar_11.m_result,&local_14f8);
                        iutest::AssertionHelper::~AssertionHelper
                                  ((AssertionHelper *)&iutest_spi_ar_11.m_result);
                        iutest::AssertionHelper::Fixed::~Fixed(&local_14f8);
                      }
                      iutest_spi_ar_1._37_3_ = 0;
                      iutest_spi_ar_1._36_1_ = !bVar1;
                      iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1368);
                      if (iutest_spi_ar_1._36_4_ == 0) {
                        iutest::detail::AlwaysZero();
                        FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                  ((AssertionResult *)local_1550,&local_1551);
                        bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_1550);
                        if (!bVar1) {
                          memset(&local_16e0,0,0x188);
                          iutest::AssertionHelper::Fixed::Fixed(&local_16e0);
                          pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1550);
                          iutest::AssertionHelper::AssertionHelper
                                    ((AssertionHelper *)&iutest_spi_ar_12.m_result,
                                     "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                     ,0x2b,pcVar2,kFatalFailure);
                          iutest::AssertionHelper::operator=
                                    ((AssertionHelper *)&iutest_spi_ar_12.m_result,&local_16e0);
                          iutest::AssertionHelper::~AssertionHelper
                                    ((AssertionHelper *)&iutest_spi_ar_12.m_result);
                          iutest::AssertionHelper::Fixed::~Fixed(&local_16e0);
                        }
                        iutest_spi_ar_1._37_3_ = 0;
                        iutest_spi_ar_1._36_1_ = !bVar1;
                        iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1550);
                        if (iutest_spi_ar_1._36_4_ == 0) {
                          iutest::detail::AlwaysZero();
                          FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                    ((AssertionResult *)local_1738,&local_1739);
                          bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_1738);
                          if (!bVar1) {
                            memset(&local_18c8,0,0x188);
                            iutest::AssertionHelper::Fixed::Fixed(&local_18c8);
                            pcVar2 = iutest::AssertionResult::message((AssertionResult *)local_1738)
                            ;
                            iutest::AssertionHelper::AssertionHelper
                                      ((AssertionHelper *)&iutest_spi_ar_13.m_result,
                                       "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                       ,0x2c,pcVar2,kFatalFailure);
                            iutest::AssertionHelper::operator=
                                      ((AssertionHelper *)&iutest_spi_ar_13.m_result,&local_18c8);
                            iutest::AssertionHelper::~AssertionHelper
                                      ((AssertionHelper *)&iutest_spi_ar_13.m_result);
                            iutest::AssertionHelper::Fixed::~Fixed(&local_18c8);
                          }
                          iutest_spi_ar_1._37_3_ = 0;
                          iutest_spi_ar_1._36_1_ = !bVar1;
                          iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1738);
                          if (iutest_spi_ar_1._36_4_ == 0) {
                            iutest::detail::AlwaysZero();
                            FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                      ((AssertionResult *)local_1920,&local_1921);
                            bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_1920);
                            if (!bVar1) {
                              memset(&local_1ab0,0,0x188);
                              iutest::AssertionHelper::Fixed::Fixed(&local_1ab0);
                              pcVar2 = iutest::AssertionResult::message
                                                 ((AssertionResult *)local_1920);
                              iutest::AssertionHelper::AssertionHelper
                                        ((AssertionHelper *)&iutest_spi_ar_14.m_result,
                                         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                         ,0x2e,pcVar2,kFatalFailure);
                              iutest::AssertionHelper::operator=
                                        ((AssertionHelper *)&iutest_spi_ar_14.m_result,&local_1ab0);
                              iutest::AssertionHelper::~AssertionHelper
                                        ((AssertionHelper *)&iutest_spi_ar_14.m_result);
                              iutest::AssertionHelper::Fixed::~Fixed(&local_1ab0);
                            }
                            iutest_spi_ar_1._37_3_ = 0;
                            iutest_spi_ar_1._36_1_ = !bVar1;
                            iutest::AssertionResult::~AssertionResult((AssertionResult *)local_1920)
                            ;
                            if (iutest_spi_ar_1._36_4_ == 0) {
                              iutest::detail::AlwaysZero();
                              FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                        ((AssertionResult *)local_1b08,&local_1b09);
                              bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_1b08);
                              if (!bVar1) {
                                memset(&local_1c98,0,0x188);
                                iutest::AssertionHelper::Fixed::Fixed(&local_1c98);
                                pcVar2 = iutest::AssertionResult::message
                                                   ((AssertionResult *)local_1b08);
                                iutest::AssertionHelper::AssertionHelper
                                          ((AssertionHelper *)&iutest_spi_ar_15.m_result,
                                           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                           ,0x2f,pcVar2,kFatalFailure);
                                iutest::AssertionHelper::operator=
                                          ((AssertionHelper *)&iutest_spi_ar_15.m_result,&local_1c98
                                          );
                                iutest::AssertionHelper::~AssertionHelper
                                          ((AssertionHelper *)&iutest_spi_ar_15.m_result);
                                iutest::AssertionHelper::Fixed::~Fixed(&local_1c98);
                              }
                              iutest_spi_ar_1._37_3_ = 0;
                              iutest_spi_ar_1._36_1_ = !bVar1;
                              iutest::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_1b08);
                              if (iutest_spi_ar_1._36_4_ == 0) {
                                iutest::detail::AlwaysZero();
                                local_1cf8.this = this;
                                FatalFailure_Sub::anon_class_8_1_8991fb9c::operator()
                                          ((AssertionResult *)local_1cf0,&local_1cf8);
                                bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                  ((AssertionResult *)local_1cf0);
                                if (!bVar1) {
                                  memset(&local_1e80,0,0x188);
                                  iutest::AssertionHelper::Fixed::Fixed(&local_1e80);
                                  pcVar2 = iutest::AssertionResult::message
                                                     ((AssertionResult *)local_1cf0);
                                  iutest::AssertionHelper::AssertionHelper
                                            ((AssertionHelper *)&iutest_spi_ar_16.m_result,
                                             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                             ,0x30,pcVar2,kFatalFailure);
                                  iutest::AssertionHelper::operator=
                                            ((AssertionHelper *)&iutest_spi_ar_16.m_result,
                                             &local_1e80);
                                  iutest::AssertionHelper::~AssertionHelper
                                            ((AssertionHelper *)&iutest_spi_ar_16.m_result);
                                  iutest::AssertionHelper::Fixed::~Fixed(&local_1e80);
                                }
                                iutest_spi_ar_1._37_3_ = 0;
                                iutest_spi_ar_1._36_1_ = !bVar1;
                                iutest::AssertionResult::~AssertionResult
                                          ((AssertionResult *)local_1cf0);
                                if (iutest_spi_ar_1._36_4_ == 0) {
                                  iutest::detail::AlwaysZero();
                                  local_1ee0.this = this;
                                  FatalFailure_Sub::anon_class_8_1_8991fb9c::operator()
                                            ((AssertionResult *)local_1ed8,&local_1ee0);
                                  bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                    ((AssertionResult *)local_1ed8);
                                  if (!bVar1) {
                                    memset(&local_2068,0,0x188);
                                    iutest::AssertionHelper::Fixed::Fixed(&local_2068);
                                    pcVar2 = iutest::AssertionResult::message
                                                       ((AssertionResult *)local_1ed8);
                                    iutest::AssertionHelper::AssertionHelper
                                              ((AssertionHelper *)&iutest_spi_ar_17.m_result,
                                               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                               ,0x31,pcVar2,kFatalFailure);
                                    iutest::AssertionHelper::operator=
                                              ((AssertionHelper *)&iutest_spi_ar_17.m_result,
                                               &local_2068);
                                    iutest::AssertionHelper::~AssertionHelper
                                              ((AssertionHelper *)&iutest_spi_ar_17.m_result);
                                    iutest::AssertionHelper::Fixed::~Fixed(&local_2068);
                                  }
                                  iutest_spi_ar_1._37_3_ = 0;
                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                  iutest::AssertionResult::~AssertionResult
                                            ((AssertionResult *)local_1ed8);
                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                    iutest::detail::AlwaysZero();
                                    FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                              ((AssertionResult *)local_20c0,&local_20c1);
                                    bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                      ((AssertionResult *)local_20c0);
                                    if (!bVar1) {
                                      memset(&local_2250,0,0x188);
                                      iutest::AssertionHelper::Fixed::Fixed(&local_2250);
                                      pcVar2 = iutest::AssertionResult::message
                                                         ((AssertionResult *)local_20c0);
                                      iutest::AssertionHelper::AssertionHelper
                                                ((AssertionHelper *)&iutest_spi_ar_18.m_result,
                                                 "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                 ,0x32,pcVar2,kFatalFailure);
                                      iutest::AssertionHelper::operator=
                                                ((AssertionHelper *)&iutest_spi_ar_18.m_result,
                                                 &local_2250);
                                      iutest::AssertionHelper::~AssertionHelper
                                                ((AssertionHelper *)&iutest_spi_ar_18.m_result);
                                      iutest::AssertionHelper::Fixed::~Fixed(&local_2250);
                                    }
                                    iutest_spi_ar_1._37_3_ = 0;
                                    iutest_spi_ar_1._36_1_ = !bVar1;
                                    iutest::AssertionResult::~AssertionResult
                                              ((AssertionResult *)local_20c0);
                                    if (iutest_spi_ar_1._36_4_ == 0) {
                                      iutest::detail::AlwaysZero();
                                      FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                                ((AssertionResult *)local_22a8,&local_22a9);
                                      bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                        ((AssertionResult *)local_22a8);
                                      if (!bVar1) {
                                        memset(&local_2438,0,0x188);
                                        iutest::AssertionHelper::Fixed::Fixed(&local_2438);
                                        pcVar2 = iutest::AssertionResult::message
                                                           ((AssertionResult *)local_22a8);
                                        iutest::AssertionHelper::AssertionHelper
                                                  ((AssertionHelper *)&iutest_spi_ar_19.m_result,
                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x33,pcVar2,kFatalFailure);
                                        iutest::AssertionHelper::operator=
                                                  ((AssertionHelper *)&iutest_spi_ar_19.m_result,
                                                   &local_2438);
                                        iutest::AssertionHelper::~AssertionHelper
                                                  ((AssertionHelper *)&iutest_spi_ar_19.m_result);
                                        iutest::AssertionHelper::Fixed::~Fixed(&local_2438);
                                      }
                                      iutest_spi_ar_1._37_3_ = 0;
                                      iutest_spi_ar_1._36_1_ = !bVar1;
                                      iutest::AssertionResult::~AssertionResult
                                                ((AssertionResult *)local_22a8);
                                      if (iutest_spi_ar_1._36_4_ == 0) {
                                        iutest::detail::AlwaysZero();
                                        FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                                  ((AssertionResult *)local_2490,&local_2491);
                                        bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                          ((AssertionResult *)local_2490);
                                        if (!bVar1) {
                                          memset(&local_2620,0,0x188);
                                          iutest::AssertionHelper::Fixed::Fixed(&local_2620);
                                          pcVar2 = iutest::AssertionResult::message
                                                             ((AssertionResult *)local_2490);
                                          iutest::AssertionHelper::AssertionHelper
                                                    ((AssertionHelper *)&iutest_spi_ar_20.m_result,
                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x3d,pcVar2,kFatalFailure);
                                          iutest::AssertionHelper::operator=
                                                    ((AssertionHelper *)&iutest_spi_ar_20.m_result,
                                                     &local_2620);
                                          iutest::AssertionHelper::~AssertionHelper
                                                    ((AssertionHelper *)&iutest_spi_ar_20.m_result);
                                          iutest::AssertionHelper::Fixed::~Fixed(&local_2620);
                                        }
                                        iutest_spi_ar_1._37_3_ = 0;
                                        iutest_spi_ar_1._36_1_ = !bVar1;
                                        iutest::AssertionResult::~AssertionResult
                                                  ((AssertionResult *)local_2490);
                                        if (iutest_spi_ar_1._36_4_ == 0) {
                                          iutest::detail::AlwaysZero();
                                          local_2680.this = this;
                                          FatalFailure_Sub::anon_class_8_1_8991fb9c::operator()
                                                    ((AssertionResult *)local_2678,&local_2680);
                                          bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                            ((AssertionResult *)local_2678);
                                          if (!bVar1) {
                                            memset(&local_2808,0,0x188);
                                            iutest::AssertionHelper::Fixed::Fixed(&local_2808);
                                            pcVar2 = iutest::AssertionResult::message
                                                               ((AssertionResult *)local_2678);
                                            iutest::AssertionHelper::AssertionHelper
                                                      ((AssertionHelper *)&iutest_spi_ar_21.m_result
                                                       ,
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x3e,pcVar2,kFatalFailure);
                                            iutest::AssertionHelper::operator=
                                                      ((AssertionHelper *)&iutest_spi_ar_21.m_result
                                                       ,&local_2808);
                                            iutest::AssertionHelper::~AssertionHelper
                                                      ((AssertionHelper *)&iutest_spi_ar_21.m_result
                                                      );
                                            iutest::AssertionHelper::Fixed::~Fixed(&local_2808);
                                          }
                                          iutest_spi_ar_1._37_3_ = 0;
                                          iutest_spi_ar_1._36_1_ = !bVar1;
                                          iutest::AssertionResult::~AssertionResult
                                                    ((AssertionResult *)local_2678);
                                          if (iutest_spi_ar_1._36_4_ == 0) {
                                            iutest::detail::AlwaysZero();
                                            FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                                      ((AssertionResult *)local_2860,&local_2861);
                                            bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                              ((AssertionResult *)local_2860);
                                            if (!bVar1) {
                                              memset(&local_29f0,0,0x188);
                                              iutest::AssertionHelper::Fixed::Fixed(&local_29f0);
                                              pcVar2 = iutest::AssertionResult::message
                                                                 ((AssertionResult *)local_2860);
                                              iutest::AssertionHelper::AssertionHelper
                                                        ((AssertionHelper *)
                                                         &iutest_spi_ar_22.m_result,
                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x41,pcVar2,kFatalFailure);
                                              iutest::AssertionHelper::operator=
                                                        ((AssertionHelper *)
                                                         &iutest_spi_ar_22.m_result,&local_29f0);
                                              iutest::AssertionHelper::~AssertionHelper
                                                        ((AssertionHelper *)
                                                         &iutest_spi_ar_22.m_result);
                                              iutest::AssertionHelper::Fixed::~Fixed(&local_29f0);
                                            }
                                            iutest_spi_ar_1._37_3_ = 0;
                                            iutest_spi_ar_1._36_1_ = !bVar1;
                                            iutest::AssertionResult::~AssertionResult
                                                      ((AssertionResult *)local_2860);
                                            if (iutest_spi_ar_1._36_4_ == 0) {
                                              iutest::detail::AlwaysZero();
                                              FatalFailure_Sub::anon_class_1_0_00000001::operator()
                                                        ((AssertionResult *)local_2a48,&local_2a49);
                                              bVar1 = iutest::AssertionResult::operator_cast_to_bool
                                                                ((AssertionResult *)local_2a48);
                                              if (!bVar1) {
                                                memset(&local_2bd8,0,0x188);
                                                iutest::AssertionHelper::Fixed::Fixed(&local_2bd8);
                                                pcVar2 = iutest::AssertionResult::message
                                                                   ((AssertionResult *)local_2a48);
                                                iutest::AssertionHelper::AssertionHelper
                                                          ((AssertionHelper *)
                                                           &iutest_spi_ar_23.m_result,
                                                                                                                      
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x42,pcVar2,kFatalFailure);
                                                iutest::AssertionHelper::operator=
                                                          ((AssertionHelper *)
                                                           &iutest_spi_ar_23.m_result,&local_2bd8);
                                                iutest::AssertionHelper::~AssertionHelper
                                                          ((AssertionHelper *)
                                                           &iutest_spi_ar_23.m_result);
                                                iutest::AssertionHelper::Fixed::~Fixed(&local_2bd8);
                                              }
                                              iutest_spi_ar_1._37_3_ = 0;
                                              iutest_spi_ar_1._36_1_ = !bVar1;
                                              iutest::AssertionResult::~AssertionResult
                                                        ((AssertionResult *)local_2a48);
                                              if (iutest_spi_ar_1._36_4_ == 0) {
                                                iutest::detail::AlwaysZero();
                                                FatalFailure_Sub::anon_class_1_0_00000001::
                                                operator()((AssertionResult *)local_2c30,&local_2c31
                                                          );
                                                bVar1 = iutest::AssertionResult::
                                                        operator_cast_to_bool
                                                                  ((AssertionResult *)local_2c30);
                                                if (!bVar1) {
                                                  memset(&local_2dc0,0,0x188);
                                                  iutest::AssertionHelper::Fixed::Fixed(&local_2dc0)
                                                  ;
                                                  pcVar2 = iutest::AssertionResult::message
                                                                     ((AssertionResult *)local_2c30)
                                                  ;
                                                  iutest::AssertionHelper::AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_24.m_result,
                                                                                                                          
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x44,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_24.m_result,&local_2dc0)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_24.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_2dc0);
                                                }
                                                iutest_spi_ar_1._37_3_ = 0;
                                                iutest_spi_ar_1._36_1_ = !bVar1;
                                                iutest::AssertionResult::~AssertionResult
                                                          ((AssertionResult *)local_2c30);
                                                if (iutest_spi_ar_1._36_4_ == 0) {
                                                  iutest::detail::AlwaysZero();
                                                  local_2e20.this = this;
                                                  FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                  operator()((AssertionResult *)local_2e18,
                                                             &local_2e20);
                                                  bVar1 = iutest::AssertionResult::
                                                          operator_cast_to_bool
                                                                    ((AssertionResult *)local_2e18);
                                                  if (!bVar1) {
                                                    memset(&local_2fa8,0,0x188);
                                                    iutest::AssertionHelper::Fixed::Fixed
                                                              (&local_2fa8);
                                                    pcVar2 = iutest::AssertionResult::message
                                                                       ((AssertionResult *)
                                                                        local_2e18);
                                                    iutest::AssertionHelper::AssertionHelper
                                                              ((AssertionHelper *)
                                                               &iutest_spi_ar_25.m_result,
                                                                                                                              
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x45,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_25.m_result,&local_2fa8)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_25.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_2fa8);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_2e18);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_3008.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_3000,
                                                               &local_3008);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_3000
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_3190,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_3190);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_3000);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_26.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x46,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_26.m_result,&local_3190)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_26.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_3190);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_3000);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_31e8,
                                                               &local_31e9);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_31e8
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_3378,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_3378);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_31e8);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_27.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x47,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_27.m_result,&local_3378)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_27.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_3378);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_31e8);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_33d8.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_33d0,
                                                               &local_33d8);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_33d0
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_3560,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_3560);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_33d0);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_28.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x48,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_28.m_result,&local_3560)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_28.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_3560);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_33d0);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_35c0.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_35b8,
                                                               &local_35c0);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_35b8
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_3748,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_3748);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_35b8);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_29.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x49,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_29.m_result,&local_3748)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_29.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_3748);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_35b8);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_37a8.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_37a0,
                                                               &local_37a8);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_37a0
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_3930,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_3930);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_37a0);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_30.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x4a,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_30.m_result,&local_3930)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_30.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_3930);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_37a0);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_3988,
                                                               &local_3989);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_3988
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_3b18,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_3b18);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_3988);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_31.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x4b,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_31.m_result,&local_3b18)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_31.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_3b18);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_3988);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_3b70,
                                                               &local_3b71);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_3b70
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_3d00,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_3d00);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_3b70);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_32.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x4c,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_32.m_result,&local_3d00)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_32.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_3d00);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_3b70);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_3d60.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_3d58,
                                                               &local_3d60);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_3d58
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_3ee8,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_3ee8);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_3d58);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_33.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x4d,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_33.m_result,&local_3ee8)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_33.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_3ee8);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_3d58);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_3f48.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_3f40,
                                                               &local_3f48);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_3f40
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_40d0,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_40d0);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_3f40);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_34.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x4e,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_34.m_result,&local_40d0)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_34.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_40d0);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_3f40);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_4130.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_4128,
                                                               &local_4130);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_4128
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_42b8,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_42b8);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_4128);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_35.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x4f,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_35.m_result,&local_42b8)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_35.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_42b8);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_4128);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_4318.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_4310,
                                                               &local_4318);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_4310
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_44a0,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_44a0);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_4310);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_36.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x50,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_36.m_result,&local_44a0)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_36.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_44a0);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_4310);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_4500.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_44f8,
                                                               &local_4500);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_44f8
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_4688,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_4688);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_44f8);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_37.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x51,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_37.m_result,&local_4688)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_37.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_4688);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_44f8);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_46e8.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_46e0,
                                                               &local_46e8);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_46e0
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_4870,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_4870);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_46e0);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_38.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x52,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_38.m_result,&local_4870)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_38.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_4870);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_46e0);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_48c8,
                                                               &local_48c9);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_48c8
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_4a58,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_4a58);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_48c8);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_39.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x53,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_39.m_result,&local_4a58)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_39.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_4a58);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_48c8);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_4ab0,
                                                               &local_4ab1);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_4ab0
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_4c40,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_4c40);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_4ab0);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_40.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x55,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_40.m_result,&local_4c40)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_40.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_4c40);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_4ab0);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_4ca0.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_4c98,
                                                               &local_4ca0);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_4c98
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_4e28,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_4e28);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_4c98);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_41.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x56,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_41.m_result,&local_4e28)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_41.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_4e28);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_4c98);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_4e88.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_4e80,
                                                               &local_4e88);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_4e80
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_5010,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_5010);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_4e80);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_42.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x57,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_42.m_result,&local_5010)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_42.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_5010);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_4e80);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_5070.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_5068,
                                                               &local_5070);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_5068
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_51f8,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_51f8);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_5068);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_43.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x58,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_43.m_result,&local_51f8)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_43.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_51f8);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_5068);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_5258.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_5250,
                                                               &local_5258);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_5250
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_53e0,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_53e0);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_5250);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_44.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x59,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_44.m_result,&local_53e0)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_44.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_53e0);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_5250);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_5440.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_5438,
                                                               &local_5440);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_5438
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_55c8,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_55c8);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_5438);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_45.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x5a,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_45.m_result,&local_55c8)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_45.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_55c8);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_5438);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_5620,
                                                               &local_5621);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_5620
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_57b0,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_57b0);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_5620);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_46.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x5b,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_46.m_result,&local_57b0)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_46.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_57b0);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_5620);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_5808,
                                                               &local_5809);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_5808
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_5998,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_5998);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_5808);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_47.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x5c,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_47.m_result,&local_5998)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_47.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_5998);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_5808);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_59f0,
                                                               &local_59f1);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_59f0
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_5b80,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_5b80);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_59f0);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_48.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x5d,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_48.m_result,&local_5b80)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_48.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_5b80);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_59f0);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_5be0.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_5bd8,
                                                               &local_5be0);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_5bd8
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_5d68,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_5d68);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_5bd8);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_49.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x5e,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_49.m_result,&local_5d68)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_49.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_5d68);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_5bd8);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_5dc8.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_5dc0,
                                                               &local_5dc8);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_5dc0
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_5f50,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_5f50);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_5dc0);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_50.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x5f,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_50.m_result,&local_5f50)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_50.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_5f50);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_5dc0);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_5fb0.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_5fa8,
                                                               &local_5fb0);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_5fa8
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_6138,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_6138);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_5fa8);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_51.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x60,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_51.m_result,&local_6138)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_51.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_6138);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_5fa8);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_6198.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_6190,
                                                               &local_6198);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6190
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_6320,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_6320);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_6190);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_52.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x61,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_52.m_result,&local_6320)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_52.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_6320);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6190);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_6378,
                                                               &local_6379);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6378
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_6508,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_6508);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_6378);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_53.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x62,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_53.m_result,&local_6508)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_53.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_6508);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6378);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_6560,
                                                               &local_6561);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6560
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_66f0,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_66f0);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_6560);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_54.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,100,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_54.m_result,&local_66f0)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_54.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_66f0);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6560);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_6748,
                                                               &local_6749);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6748
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_68d8,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_68d8);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_6748);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_55.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x65,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_55.m_result,&local_68d8)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_55.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_68d8);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6748);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_6930,
                                                               &local_6931);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6930
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_6ac0,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_6ac0);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_6930);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_56.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x66,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_56.m_result,&local_6ac0)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_56.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_6ac0);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6930);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_6b18,
                                                               &local_6b19);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6b18
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_6ca8,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_6ca8);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_6b18);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_57.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x67,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_57.m_result,&local_6ca8)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_57.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_6ca8);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6b18);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_6d00,
                                                               &local_6d01);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6d00
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_6e90,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_6e90);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_6d00);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_58.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x68,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_58.m_result,&local_6e90)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_58.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_6e90);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6d00);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_6ee8,
                                                               &local_6ee9);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_6ee8
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_7078,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_7078);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_6ee8);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_59.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x6a,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_59.m_result,&local_7078)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_59.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_7078);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_6ee8);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_70d0,
                                                               &local_70d1);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_70d0
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_7260,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_7260);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_70d0);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_60.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x73,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_60.m_result,&local_7260)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_60.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_7260);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_70d0);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_72c0.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_72b8,
                                                               &local_72c0);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_72b8
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_7448,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_7448);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_72b8);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_61.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x74,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_61.m_result,&local_7448)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_61.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_7448);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_72b8);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_74a8.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_74a0,
                                                               &local_74a8);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_74a0
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_7630,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_7630);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_74a0);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_62.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x75,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_62.m_result,&local_7630)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_62.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_7630);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_74a0);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_7688,
                                                               &local_7689);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_7688
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_7818,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_7818);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_7688);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_63.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x77,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_63.m_result,&local_7818)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_63.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_7818);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7688);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_7870,
                                                               &local_7871);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_7870
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_7a00,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_7a00);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_7870);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_64.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x79,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_64.m_result,&local_7a00)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_64.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_7a00);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7870);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_7a60.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_7a58,
                                                               &local_7a60);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_7a58
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_7be8,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_7be8);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_7a58);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_65.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x7a,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_65.m_result,&local_7be8)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_65.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_7be8);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7a58);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_7c48.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_7c40,
                                                               &local_7c48);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_7c40
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_7dd0,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_7dd0);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_7c40);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_66.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x7c,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_66.m_result,&local_7dd0)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_66.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_7dd0);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7c40);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_7e30.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_7e28,
                                                               &local_7e30);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_7e28
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_7fb8,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_7fb8);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_7e28);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_67.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x7d,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_67.m_result,&local_7fb8)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_67.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_7fb8);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_7e28);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_8018.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_8010,
                                                               &local_8018);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_8010
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_81a0,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_81a0);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_8010);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_68.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x7e,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_68.m_result,&local_81a0)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_68.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_81a0);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_8010);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_8200.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_81f8,
                                                               &local_8200);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_81f8
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_8388,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_8388);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_81f8);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_69.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x80,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_69.m_result,&local_8388)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_69.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_8388);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_81f8);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_83e8.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_83e0,
                                                               &local_83e8);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_83e0
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_8570,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_8570);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_83e0);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_70.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x82,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_70.m_result,&local_8570)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_70.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_8570);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_83e0);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_85d0.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_85c8,
                                                               &local_85d0);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_85c8
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_8758,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_8758);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_85c8);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_71.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x83,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_71.m_result,&local_8758)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_71.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_8758);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_85c8);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_87b8.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_87b0,
                                                               &local_87b8);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_87b0
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_8940,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_8940);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_87b0);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_72.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x84,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_72.m_result,&local_8940)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_72.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_8940);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_87b0);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_89a0.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_8998,
                                                               &local_89a0);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_8998
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_8b28,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_8b28);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_8998);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_73.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x86,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_73.m_result,&local_8b28)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_73.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_8b28);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_8998);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_8b80,
                                                               &local_8b81);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_8b80
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_8d10,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_8d10);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_8b80);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_74.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x88,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_74.m_result,&local_8d10)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_74.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_8d10);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_8b80);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_8d68,
                                                               &local_8d69);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_8d68
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_8ef8,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_8ef8);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_8d68);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_75.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x8b,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_75.m_result,&local_8ef8)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_75.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_8ef8);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_8d68);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_8f58.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_8f50,
                                                               &local_8f58);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_8f50
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_90e0,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_90e0);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_8f50);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_76.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x8c,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_76.m_result,&local_90e0)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_76.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_90e0);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_8f50);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_9138,
                                                               &local_9139);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_9138
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_92c8,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_92c8);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_9138);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_77.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x8d,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_77.m_result,&local_92c8)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_77.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_92c8);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_9138);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_9320,
                                                               &local_9321);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_9320
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_94b0,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_94b0);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_9320);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_78.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x8e,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_78.m_result,&local_94b0)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_78.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_94b0);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_9320);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_9510.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_9508,
                                                               &local_9510);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_9508
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_9698,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_9698);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_9508);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_79.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x8f,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_79.m_result,&local_9698)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_79.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_9698);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_9508);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_96f0,
                                                               &local_96f1);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_96f0
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_9880,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_9880);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_96f0);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_80.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x90,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_80.m_result,&local_9880)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_80.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_9880);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_96f0);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    FatalFailure_Sub::anon_class_1_0_00000001::
                                                    operator()((AssertionResult *)local_98d8,
                                                               &local_98d9);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_98d8
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_9a68,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_9a68);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_98d8);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_81.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x91,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_81.m_result,&local_9a68)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_81.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_9a68);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_98d8);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_9ac8.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_9ac0,
                                                               &local_9ac8);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_9ac0
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_9c50,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_9c50);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_9ac0);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                ((AssertionHelper *)
                                                                 &iutest_spi_ar_82.m_result,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x95,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_82.m_result,&local_9c50)
                                                  ;
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            ((AssertionHelper *)
                                                             &iutest_spi_ar_82.m_result);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_9c50);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_9ac0);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    iutest::detail::AlwaysZero();
                                                    local_9cb0.this = this;
                                                    FatalFailure_Sub::anon_class_8_1_8991fb9c::
                                                    operator()((AssertionResult *)local_9ca8,
                                                               &local_9cb0);
                                                    bVar1 = iutest::AssertionResult::
                                                            operator_cast_to_bool
                                                                      ((AssertionResult *)local_9ca8
                                                                      );
                                                    if (!bVar1) {
                                                      memset(&local_9e38,0,0x188);
                                                      iutest::AssertionHelper::Fixed::Fixed
                                                                (&local_9e38);
                                                      pcVar2 = iutest::AssertionResult::message
                                                                         ((AssertionResult *)
                                                                          local_9ca8);
                                                      iutest::AssertionHelper::AssertionHelper
                                                                (&local_9e68,
                                                                                                                                  
                                                  "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_tests_decl.cpp"
                                                  ,0x96,pcVar2,kFatalFailure);
                                                  iutest::AssertionHelper::operator=
                                                            (&local_9e68,&local_9e38);
                                                  iutest::AssertionHelper::~AssertionHelper
                                                            (&local_9e68);
                                                  iutest::AssertionHelper::Fixed::~Fixed
                                                            (&local_9e38);
                                                  }
                                                  iutest_spi_ar_1._37_3_ = 0;
                                                  iutest_spi_ar_1._36_1_ = !bVar1;
                                                  iutest::AssertionResult::~AssertionResult
                                                            ((AssertionResult *)local_9ca8);
                                                  if (iutest_spi_ar_1._36_4_ == 0) {
                                                    *(int *)iutest_spi_ar._32_8_ =
                                                         *(int *)iutest_spi_ar._32_8_ + 1;
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void SPITest::FatalFailure_Sub(int& count)
{
    #define FLAVOR(n) IUTEST_ASSERT##n
    #define FAILURE_MACRO IUTEST_ASSERT_FATAL_FAILURE

#include "spi_tests_decl.cpp"

    #undef FLAVOR
    #undef FAILURE_MACRO

    count++;
}